

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

void print_custom_message(object *obj,char *string,wchar_t msg_type,player *p)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  byte *pbVar8;
  size_t end;
  char buf [1024];
  size_t local_458;
  object *local_450;
  wchar_t local_444;
  player *local_440;
  char local_438 [1032];
  
  local_450 = obj;
  memset(local_438,0,0x400);
  local_458 = 0;
  if (string != (char *)0x0) {
    local_444 = msg_type;
    pcVar4 = strchr(string,0x7b);
    if (pcVar4 != (char *)0x0) {
      local_440 = p;
      do {
        strnfcat(local_438,0x400,&local_458,"%.*s",(ulong)(uint)((int)pcVar4 - (int)string),string);
        string = pcVar4 + 1;
        bVar1 = pcVar4[1];
        if (bVar1 != 0) {
          ppuVar5 = __ctype_b_loc();
          pbVar8 = (byte *)(pcVar4 + 2);
          bVar2 = bVar1;
          do {
            if ((*(byte *)((long)*ppuVar5 + (ulong)bVar2 * 2 + 1) & 4) == 0) {
              if (bVar2 != 0x7d) break;
              iVar3 = strncmp(string,"name",4);
              if (iVar3 == 0) {
                if (local_450 != (object *)0x0) {
                  sVar6 = object_desc(local_438,0x400,local_450,0x40,local_440);
                  local_458 = local_458 + sVar6;
                  string = (char *)pbVar8;
                  break;
                }
LAB_0019cb04:
                pcVar4 = "hands";
              }
              else {
                iVar3 = strncmp(string,"kind",4);
                if (iVar3 == 0) {
                  if (local_450 == (object *)0x0) goto LAB_0019cb04;
                  object_kind_name(local_438 + local_458,0x400 - local_458,local_450->kind,true);
                  sVar6 = local_458;
                  sVar7 = strlen(local_438 + local_458);
                  local_458 = sVar7 + sVar6;
                  string = (char *)pbVar8;
                  break;
                }
                if (bVar1 == 0x69) {
                  string = (char *)pbVar8;
                  if (pcVar4[2] != 's') break;
                  if ((local_450 == (object *)0x0) || (1 < local_450->number)) {
                    pcVar4 = "are";
                  }
                  else {
                    pcVar4 = "is";
                  }
                }
                else {
                  string = (char *)pbVar8;
                  if (((bVar1 != 0x73) || (local_450 == (object *)0x0)) ||
                     (local_450->number != '\x01')) break;
                  pcVar4 = "s";
                }
              }
              strnfcat(local_438,0x400,&local_458,pcVar4);
              string = (char *)pbVar8;
              break;
            }
            bVar2 = *pbVar8;
            pbVar8 = pbVar8 + 1;
          } while (bVar2 != 0);
        }
        pcVar4 = strchr(string,0x7b);
      } while (pcVar4 != (char *)0x0);
    }
    strnfcat(local_438,0x400,&local_458,"%s",string);
    msgt(local_444,"%s",local_438);
  }
  return;
}

Assistant:

void print_custom_message(const struct object *obj, const char *string,
		int msg_type, const struct player *p)
{
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	size_t end = 0;

	/* Not always a string */
	if (!string) return;

	next = strchr(string, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - string),
			string);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			string = s + 1;

			switch(msg_tag_lookup(tag)) {
			case MSG_TAG_NAME:
				if (obj) {
					end += object_desc(buf, 1024, obj,
						ODESC_PREFIX | ODESC_BASE, p);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_KIND:
				if (obj) {
					object_kind_name(&buf[end], 1024 - end, obj->kind, true);
					end += strlen(&buf[end]);
				} else {
					strnfcat(buf, 1024, &end, "hands");
				}
				break;
			case MSG_TAG_VERB:
				if (obj && obj->number == 1) {
					strnfcat(buf, 1024, &end, "s");
				}
				break;
			case MSG_TAG_VERB_IS:
				if ((!obj) || (obj->number > 1)) {
					strnfcat(buf, 1024, &end, "are");
				} else {
					strnfcat(buf, 1024, &end, "is");
				}
			default:
				break;
			}
		} else
			/* An invalid tag, skip it */
			string = next + 1;

		next = strchr(string, '{');
	}
	strnfcat(buf, 1024, &end, "%s", string);

	msgt(msg_type, "%s", buf);
}